

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords(Dictionary *this,int32_t i)

{
  const_reference pvVar1;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/dictionary.cc"
                  ,0x56,
                  "const std::vector<int32_t> &fasttext::Dictionary::getSubwords(int32_t) const");
  }
  if (in_ESI < *(int *)(in_RDI + 0x5c)) {
    pvVar1 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                       ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28)
                        ,(long)in_ESI);
    return &pvVar1->subwords;
  }
  __assert_fail("i < nwords_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/dictionary.cc"
                ,0x57,"const std::vector<int32_t> &fasttext::Dictionary::getSubwords(int32_t) const"
               );
}

Assistant:

const std::vector<int32_t>& Dictionary::getSubwords(int32_t i) const {
  assert(i >= 0);
  assert(i < nwords_);
  return words_[i].subwords;
}